

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghpattern.cc
# Opt level: O1

Pattern * __thiscall OrPattern::commonSubPattern(OrPattern *this,Pattern *b,int4 sa)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  pointer ppDVar3;
  Pattern *pPVar4;
  Pattern *pPVar2;
  
  ppDVar3 = (this->orlist).super__Vector_base<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  iVar1 = (*((*ppDVar3)->super_Pattern)._vptr_Pattern[6])();
  pPVar2 = (Pattern *)CONCAT44(extraout_var,iVar1);
  ppDVar3 = ppDVar3 + 1;
  if (ppDVar3 !=
      (this->orlist).super__Vector_base<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    pPVar4 = pPVar2;
    do {
      iVar1 = (*((*ppDVar3)->super_Pattern)._vptr_Pattern[6])
                        (*ppDVar3,pPVar4,(ulong)(uint)(sa >> 0x1f & sa));
      pPVar2 = (Pattern *)CONCAT44(extraout_var_00,iVar1);
      if (pPVar4 != (Pattern *)0x0) {
        (*pPVar4->_vptr_Pattern[1])(pPVar4);
      }
      ppDVar3 = ppDVar3 + 1;
      pPVar4 = pPVar2;
    } while (ppDVar3 !=
             (this->orlist).
             super__Vector_base<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  return pPVar2;
}

Assistant:

Pattern *OrPattern::commonSubPattern(const Pattern *b,int4 sa) const

{
  vector<DisjointPattern *>::const_iterator iter;
  Pattern *res,*next;

  iter = orlist.begin();
  res = (*iter)->commonSubPattern(b,sa);
  iter++;

  if (sa > 0)
    sa = 0;
  while(iter!=orlist.end()) {
    next = (*iter)->commonSubPattern(res,sa);
    delete res;
    res = next;
    ++iter;
  }
  return res;
}